

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  uint uVar1;
  pointer pTVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Result RVar5;
  Enum EVar6;
  undefined4 local_a0;
  undefined2 local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined4 uStack_88;
  undefined2 uStack_84;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar5 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar5.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      uVar1 = (var->field_2).index_;
      pTVar2 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar6 = pTVar2[uVar1].element.enum_;
      uVar3 = *(undefined8 *)((long)&pTVar2[uVar1].limits.max + 2);
      uStack_88 = (undefined4)((ulong)uVar3 >> 0x10);
      uStack_84 = (undefined2)((ulong)uVar3 >> 0x30);
      uVar3 = *(undefined8 *)&pTVar2[uVar1].field_0x4;
      uVar4 = *(undefined8 *)(&pTVar2[uVar1].field_0x4 + 8);
      local_98 = (undefined4)uVar3;
      uStack_94 = (undefined4)((ulong)uVar3 >> 0x20);
      uStack_90 = (undefined4)uVar4;
      uStack_8c = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_8a = (undefined2)((ulong)uVar4 >> 0x30);
      local_a0 = *(undefined4 *)&pTVar2[uVar1].limits.field_0x12;
      local_9c = *(undefined2 *)&pTVar2[uVar1].limits.field_0x16;
    }
    else {
      local_98 = 0;
      EVar6 = Any;
      local_9c = 0;
      local_a0 = 0;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      uStack_8a = 0;
      uStack_88 = 0;
      uStack_84 = 0;
    }
    (out->element).enum_ = EVar6;
    *(ulong *)&out->field_0x4 = CONCAT44(uStack_94,local_98);
    *(ulong *)((long)&(out->limits).initial + 4) = CONCAT26(uStack_8a,CONCAT24(uStack_8c,uStack_90))
    ;
    *(ulong *)((long)&(out->limits).max + 2) = CONCAT26(uStack_84,CONCAT42(uStack_88,uStack_8a));
    *(undefined4 *)&(out->limits).field_0x12 = local_a0;
    *(undefined2 *)&(out->limits).field_0x16 = local_9c;
  }
  return (Result)RVar5.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}